

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

size_t __thiscall
andres::View<short,_true,_std::allocator<unsigned_long>_>::shape
          (View<short,_true,_std::allocator<unsigned_long>_> *this,size_t dimension)

{
  size_t sVar1;
  
  testInvariant(this);
  marray_detail::Assert<bool>(*(long *)this != 0);
  sVar1 = View<short,_true,_std::allocator<unsigned_long>_>::dimension(this);
  marray_detail::Assert<bool>(dimension < sVar1);
  sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                    ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),dimension);
  return sVar1;
}

Assistant:

inline const std::size_t
View<T, isConst, A>::shape
(
    const std::size_t dimension
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_DEBUG || data_ != 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || dimension < this->dimension());
    return geometry_.shape(dimension);
}